

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

Real __thiscall PeleLM::adjust_p_and_divu_for_closed_chamber(PeleLM *this,MultiFab *mac_divu)

{
  pointer pSVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  Real RVar5;
  Real RVar6;
  char cVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  PeleLM *this_01;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_02;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Long LVar15;
  Long LVar16;
  int n;
  TimeCenter TVar17;
  int iVar18;
  long lVar19;
  double *pdVar20;
  int iVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  double *pdVar28;
  bool bVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  Real tT;
  Real y [21];
  Real cpor [21];
  MFIter mfi;
  Real tresult [21];
  MultiFab theta_halft;
  undefined1 local_ae8 [32];
  double local_ac8;
  double dStack_ac0;
  double local_ab8;
  double dStack_ab0;
  double local_aa8;
  double dStack_aa0;
  double local_a98;
  double dStack_a90;
  double local_a88;
  double local_a80;
  double dStack_a78;
  double local_a70;
  double dStack_a68;
  double local_a60;
  double dStack_a58;
  double local_a50;
  double dStack_a48;
  double local_a38;
  undefined8 uStack_a30;
  double local_a28;
  undefined8 uStack_a20;
  PeleLM *local_a18;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_a10;
  long local_a08;
  long local_a00;
  double *local_9f8;
  long local_9f0;
  long local_9e8;
  double *local_9e0;
  long local_9d8;
  long local_9d0;
  double *local_9c8;
  long local_9c0;
  long local_9b8;
  double *local_9b0;
  long local_9a8;
  long local_9a0;
  double *local_998;
  long local_990;
  long local_988;
  long local_980;
  long local_978;
  long local_970;
  long local_968;
  long local_960;
  long local_958;
  long local_950;
  long local_948;
  double *local_940;
  double *local_938;
  double *local_930;
  double *local_928;
  double *local_920;
  long local_918;
  long local_910;
  long local_908;
  double *local_900;
  double *local_8f8;
  double *local_8f0;
  double *local_8e8;
  double *local_8e0;
  Box local_8d4;
  double local_8b8;
  double dStack_8b0;
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double dStack_890;
  double local_888;
  undefined8 uStack_880;
  double local_878;
  double dStack_870;
  double local_868;
  undefined8 uStack_860;
  double local_858;
  double dStack_850;
  double local_848;
  double dStack_840;
  double local_838;
  undefined8 uStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  undefined8 uStack_810;
  double local_808;
  double dStack_800;
  double local_7f8;
  double dStack_7f0;
  double local_7e8;
  double dStack_7e0;
  double local_7d8;
  double dStack_7d0;
  Array4<const_double> local_7c8;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined1 local_718 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_708;
  double local_6f0;
  double local_6e8;
  Vector<int,_std::allocator<int>_> *pVStack_6e0;
  Vector<int,_std::allocator<int>_> *local_6d8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *pVStack_6d0;
  Vector<int,_std::allocator<int>_> *local_6c8;
  Vector<int,_std::allocator<int>_> *pVStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  undefined1 local_688 [16];
  double local_678;
  Real local_588;
  Real RStack_580;
  double local_578;
  undefined8 uStack_570;
  double local_568;
  double local_558;
  double local_548;
  double dStack_540;
  double local_538;
  double dStack_530;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  undefined8 uStack_4b0;
  double local_4a8;
  double dStack_4a0;
  double local_498;
  double dStack_490;
  double local_488;
  undefined8 uStack_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  undefined8 uStack_410;
  double local_408;
  undefined8 uStack_400;
  Array4<const_double> local_3f8;
  Array4<const_double> local_3b8;
  Array4<double> local_378;
  Array4<const_double> local_338;
  Array4<const_double> local_2f8;
  MFIter local_2b8;
  Array4<double> local_258 [2];
  FabArray<amrex::FArrayBox> local_1b0;
  
  pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a10._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  TVar17 = amrex::StateDescriptor::timeType(pSVar1->desc);
  if (TVar17 == Point) {
    dVar2 = (pSVar1->old_time).stop;
  }
  else {
    dVar2 = ((pSVar1->old_time).start + (pSVar1->old_time).stop) * 0.5;
  }
  pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar17 = amrex::StateDescriptor::timeType(pSVar1->desc);
  if (TVar17 == Point) {
    dVar3 = (pSVar1->new_time).stop;
  }
  else {
    dVar3 = ((pSVar1->new_time).start + (pSVar1->new_time).stop) * 0.5;
  }
  local_718._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_718._8_8_ = (FabArrayBase *)0x0;
  vStack_708.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_708.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_708.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258[0].p = (double *)&PTR__FabFactory_0080b918;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,&(this->super_NavierStokesBase).super_AmrLevel.grids,
             &(this->super_NavierStokesBase).super_AmrLevel.dmap,1,nGrowAdvForcing,
             (MFInfo *)local_718,(FabFactory<amrex::FArrayBox> *)local_258);
  local_a18 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_708);
  amrex::MFIter::MFIter
            (&local_2b8,
             (FabArrayBase *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
  if (local_2b8.currentIndex < local_2b8.endIndex) {
    do {
      amrex::MFIter::tilebox(&local_8d4,&local_2b8);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_3b8,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,first_spec)
      ;
      this_02._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_a10;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_3f8,
                 (FabArray<amrex::FArrayBox> *)
                 local_a10._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,first_spec)
      ;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2f8,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,
                 NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_338,
                 (FabArray<amrex::FArrayBox> *)
                 this_02._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,
                 NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_378,&local_1b0,&local_2b8);
      LVar16 = local_3b8.nstride;
      LVar15 = local_3f8.nstride;
      iVar14 = local_8d4.bigend.vect[2];
      iVar13 = local_8d4.bigend.vect[1];
      iVar12 = local_8d4.bigend.vect[0];
      iVar11 = local_8d4.smallend.vect[1];
      iVar21 = local_8d4.smallend.vect[0];
      if (local_8d4.smallend.vect[2] <= local_8d4.bigend.vect[2]) {
        local_588 = p_amb_old;
        RStack_580 = p_amb_new;
        local_9c8 = local_2f8.p;
        local_998 = local_3b8.p + -(long)local_3b8.begin.x;
        local_968 = local_2f8.jstride;
        local_9b0 = local_3f8.p + -(long)local_3f8.begin.x;
        local_9d0 = local_2f8.kstride;
        local_9a0 = local_3b8.kstride << 3;
        local_9a8 = -(long)local_3b8.begin.z;
        local_948 = local_3b8.jstride << 3;
        local_950 = -(long)local_3b8.begin.y;
        local_9b8 = local_3f8.kstride << 3;
        local_9c0 = -(long)local_3f8.begin.z;
        local_958 = local_3f8.jstride << 3;
        local_960 = -(long)local_3f8.begin.y;
        local_908 = (long)local_2f8.begin.x;
        local_970 = (long)local_2f8.begin.y;
        local_9d8 = (long)local_2f8.begin.z;
        local_9e0 = local_338.p;
        local_978 = local_338.jstride;
        local_9e8 = local_338.kstride;
        local_910 = (long)local_338.begin.x;
        local_980 = (long)local_338.begin.y;
        local_9f0 = (long)local_338.begin.z;
        local_9f8 = local_378.p;
        local_988 = local_378.jstride;
        local_a00 = local_378.kstride;
        local_918 = (long)local_378.begin.x;
        local_990 = (long)local_378.begin.y;
        local_a08 = (long)local_378.begin.z;
        iVar9 = local_8d4.smallend.vect[2];
        do {
          if (iVar11 <= iVar13) {
            lVar19 = (long)iVar9;
            local_920 = (double *)((local_9c0 + lVar19) * local_9b8 + (long)local_9b0);
            local_928 = (double *)((local_9a8 + lVar19) * local_9a0 + (long)local_998);
            local_930 = local_9c8 + (lVar19 - local_9d8) * local_9d0;
            local_938 = local_9e0 + (lVar19 - local_9f0) * local_9e8;
            local_940 = local_9f8 + (lVar19 - local_a08) * local_a00;
            iVar10 = iVar11;
            do {
              if (iVar21 <= iVar12) {
                lVar19 = (long)iVar10;
                local_8e0 = (double *)((local_960 + lVar19) * local_958 + (long)local_920);
                local_8e8 = (double *)((local_950 + lVar19) * local_948 + (long)local_928);
                local_8f0 = local_930 + (lVar19 - local_970) * local_968;
                local_8f8 = local_938 + (lVar19 - local_980) * local_978;
                local_900 = local_940 + (lVar19 - local_990) * local_988;
                iVar18 = iVar21;
                do {
                  pdVar23 = local_8e0 + iVar18;
                  pdVar28 = local_8e0 + iVar18;
                  pdVar26 = local_8e8 + iVar18;
                  pdVar20 = local_8e8 + iVar18;
                  dVar46 = 0.0;
                  lVar19 = 0x15;
                  do {
                    dVar46 = dVar46 + *pdVar20;
                    pdVar20 = pdVar20 + LVar16;
                    lVar19 = lVar19 + -1;
                  } while (lVar19 != 0);
                  memset(local_ae8,0,0xa8);
                  lVar19 = 0;
                  do {
                    *(double *)(local_ae8 + lVar19 * 8) = *pdVar26 * (1.0 / dVar46);
                    lVar19 = lVar19 + 1;
                    pdVar26 = pdVar26 + LVar16;
                  } while (lVar19 != 0x15);
                  local_408 = local_8f0[iVar18 - local_908];
                  dVar46 = local_408 * local_408;
                  local_a38 = local_408 * dVar46;
                  local_a28 = local_408 * local_a38;
                  local_7c8.p = (double *)0x3fdfbefbefbefbf0;
                  local_7c8.jstride = 0x3fefbefbefbefbf0;
                  local_7c8.kstride = 0x3fb000418a43bf8c;
                  local_7c8.nstride = 0x3fa000418a43bf8c;
                  local_7c8.begin.x = -0x48f1ed02;
                  local_7c8.begin.y = 0x3fae1af1;
                  local_7c8.begin.z = -0xa963427;
                  local_7c8.end.x = 0x3fac6bb6;
                  local_7c8.end.y = 0x42c3dbd3;
                  local_7c8.end.z = 0x3f9f0650;
                  local_7c8.ncomp = -0x2085bd62;
                  local_7c8._60_4_ = 0x3fb24021;
                  local_788 = 0x3fb24021df7a429e;
                  uStack_780 = 0x3fb106e55a53f15b;
                  local_778 = 0x3fafea0b02aa32d7;
                  uStack_770 = 0x3fa24778bbe8f7dd;
                  local_768 = 0x3f9744998b9a1c0d;
                  uStack_760 = 0x3fa1a4eba7fd99b3;
                  local_758 = 0x3fa10d488e47ecc4;
                  uStack_750 = 0x3fa07f7f2eefd932;
                  local_748 = 0x3fa24021df7a429e;
                  uStack_740 = 0x3fa19e14f6ff5920;
                  local_738 = 0x3fa106e55a53f15b;
                  uStack_730 = 0x3fa246cdaf410bdd;
                  local_728 = 0x3f99a1cd6070c7ee;
                  if (1000.0 <= local_408) {
                    local_718._0_8_ =
                         (FabArrayBase *)
                         (local_a28 * 2.00255376e-14 +
                         local_a38 * -1.79566394e-10 +
                         dVar46 * 4.99456778e-07 + local_408 * -4.94024731e-05 + 3.3372792);
                    local_718._8_8_ =
                         (FabArrayBase *)
                         (local_a28 * 4.98197357e-22 +
                         local_a38 * -4.73515235e-18 +
                         dVar46 * 1.61561948e-14 + local_408 * -2.30842973e-11 + 2.50000001);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_a28 * 1.22833691e-15 +
                                  local_a38 * -1.00177799e-11 +
                                  dVar46 * 4.19484589e-08 + local_408 * -8.59741137e-05 + 2.56942078
                                  );
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(local_a28 * -2.16717794e-14 +
                                  local_a38 * 2.09470555e-10 +
                                  dVar46 * -7.57966669e-07 + local_408 * 0.00148308754 + 3.28253784)
                    ;
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(local_a28 * 1.17412376e-14 +
                                  local_a38 * -8.79461556e-11 +
                                  dVar46 * 1.26505228e-07 + local_408 * 0.000548429716 + 3.09288767)
                    ;
                    local_6f0 = local_a28 * 1.68200992e-14 +
                                local_a38 * -9.7041987e-11 +
                                dVar46 * -1.64072518e-07 + local_408 * 0.00217691804 + 3.03399249;
                    local_6e8 = local_a28 * -1.07908535e-14 +
                                local_a38 * 1.1424637e-10 +
                                dVar46 * -6.3365815e-07 + local_408 * 0.00223982013 + 4.0172109;
                    pVStack_6e0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a28 * -1.87727567e-14 +
                                  local_a38 * 2.60179549e-10 +
                                  dVar46 * -1.40894597e-06 + local_408 * 0.00365639292 + 2.87410113)
                    ;
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a28 * -3.39716365e-14 +
                                local_a38 * 4.17906e-10 +
                                dVar46 * -2.01191947e-06 + local_408 * 0.00465588637 + 2.29203842);
                    pVStack_6d0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (local_a28 * -4.67154394e-14 +
                                  local_a38 * 5.95684644e-10 +
                                  dVar46 * -2.98714348e-06 + local_408 * 0.00723990037 + 2.28571772)
                    ;
                    local_6c8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a28 * -1.0181523e-13 +
                                local_a38 * 1.22292535e-09 +
                                dVar46 * -5.73285809e-06 + local_408 * 0.0133909467 + 0.074851495);
                    pVStack_6c0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a28 * -2.03647716e-14 +
                                  local_a38 * 2.30053008e-10 +
                                  dVar46 * -9.98825771e-07 + local_408 * 0.00206252743 + 2.71518561)
                    ;
                    local_6b8 = local_a28 * -4.72084164e-14 +
                                local_a38 * 5.23490188e-10 +
                                dVar46 * -2.21481404e-06 + local_408 * 0.00441437026 + 3.85746029;
                    dStack_6b0 = local_a28 * -5.33508711e-14 +
                                 local_a38 * 5.89161778e-10 +
                                 dVar46 * -2.48445613e-06 + local_408 * 0.00495695526 + 2.77217438;
                    local_6a8 = local_a28 * -8.8385564e-14 +
                                local_a38 * 1.00641212e-09 +
                                dVar46 * -4.42258813e-06 + local_408 * 0.00920000082 + 1.76069008;
                    dStack_6a0 = local_a28 * -2.112616e-14 +
                                 local_a38 * 3.944431e-10 +
                                 dVar46 * -2.656384e-06 + local_408 * 0.007871497 + 3.770799;
                    local_698 = local_a28 * -1.25706061e-13 +
                                local_a38 * 1.47222923e-09 +
                                dVar46 * -6.71077915e-06 + local_408 * 0.0146454151 + 2.03611116;
                    dStack_690 = local_a28 * -1.49641576e-13 +
                                 local_a38 * 1.75217689e-09 +
                                 dVar46 * -7.98206668e-06 + local_408 * 0.0173972722 + 1.95465642;
                    dVar33 = local_a38 * 2.21412001e-09 +
                             dVar46 * -1.00256067e-05 + local_408 * 0.0216852677 + 1.0718815;
                    dVar35 = local_a38 * 1.0097038e-10 +
                             dVar46 * -5.68476e-07 + local_408 * 0.0014879768 + 2.92664;
                    dVar4 = -1.9000289e-13;
                    dVar30 = -6.753351e-15;
                  }
                  else {
                    local_718._0_8_ =
                         local_a28 * -7.37611761e-12 +
                         local_a38 * 2.01572094e-08 +
                         dVar46 * -1.9478151e-05 + local_408 * 0.00798052075 + 2.34433112;
                    local_718._8_8_ =
                         (FabArrayBase *)
                         (local_a28 * -9.27732332e-22 +
                         local_a38 * 2.30081632e-18 +
                         dVar46 * -1.99591964e-15 + local_408 * 7.05332819e-13 + 2.5);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_a28 * 2.11265971e-12 +
                                  local_a38 * -6.12806624e-09 +
                                  dVar46 * 6.64306396e-06 + local_408 * -0.00327931884 + 3.1682671);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(local_a28 * 3.24372837e-12 +
                                  local_a38 * -9.68129509e-09 +
                                  dVar46 * 9.84730201e-06 + local_408 * -0.00299673416 + 3.78245636)
                    ;
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(local_a28 * 1.3641147e-12 +
                                  local_a38 * -3.88113333e-09 +
                                  dVar46 * 4.61793841e-06 + local_408 * -0.00240131752 + 3.99201543)
                    ;
                    local_6f0 = local_a28 * 1.77197817e-12 +
                                local_a38 * -5.48797062e-09 +
                                dVar46 * 6.52040211e-06 + local_408 * -0.0020364341 + 4.19864056;
                    local_6e8 = local_a28 * 9.29225124e-12 +
                                local_a38 * -2.42763894e-08 +
                                dVar46 * 2.11582891e-05 + local_408 * -0.00474912051 + 4.30179801;
                    pVStack_6e0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a28 * 1.68741719e-12 +
                                  local_a38 * -3.85091153e-09 +
                                  dVar46 * 2.79489841e-06 + local_408 * 0.000968872143 + 3.76267867)
                    ;
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a28 * 1.94314737e-12 +
                                local_a38 * -6.68815981e-09 +
                                dVar46 * 8.2329622e-06 + local_408 * -0.00236661419 + 4.19860411);
                    pVStack_6d0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (local_a28 * 2.54385734e-12 +
                                  local_a38 * -6.87117425e-09 +
                                  dVar46 * 5.73021856e-06 + local_408 * 0.00201095175 + 3.6735904);
                    local_6c8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a28 * 1.66693956e-11 +
                                local_a38 * -4.84743026e-08 +
                                dVar46 * 4.91800599e-05 + local_408 * -0.0136709788 + 5.14987613);
                    pVStack_6c0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a28 * -9.04424499e-13 +
                                  local_a38 * 9.07005884e-10 +
                                  dVar46 * 1.01681433e-06 + local_408 * -0.00061035368 + 3.57953347)
                    ;
                    local_6b8 = local_a28 * -1.43699548e-13 +
                                local_a38 * 2.45919022e-09 +
                                dVar46 * -7.12356269e-06 + local_408 * 0.00898459677 + 2.35677352;
                    dStack_6b0 = local_a28 * 4.33768865e-12 +
                                 local_a38 * -1.33144093e-08 +
                                 dVar46 * 1.37799446e-05 + local_408 * -0.00324392532 + 4.22118584;
                    local_6a8 = local_a28 * 1.31772652e-11 +
                                local_a38 * -3.79285261e-08 +
                                dVar46 * 3.73220008e-05 + local_408 * -0.00990833369 + 4.79372315;
                    dStack_6a0 = local_a28 * 2.07561e-12 +
                                 local_a38 * -7.377636e-09 +
                                 dVar46 * 5.338472e-06 + local_408 * 0.007216595 + 2.106204;
                    local_698 = local_a28 * 2.69884373e-11 +
                                local_a38 * -6.91588753e-08 +
                                dVar46 * 5.70990292e-05 + local_408 * -0.00757052247 + 3.95920148;
                    dStack_690 = local_a28 * 2.30509004e-11 +
                                 local_a38 * -5.99126606e-08 +
                                 dVar46 * 4.97142807e-05 + local_408 * -0.00418658892 + 4.30646568;
                    dVar33 = local_a38 * -7.08466285e-08 +
                             dVar46 * 5.99438288e-05 + local_408 * -0.0055015427 + 4.29142492;
                    dVar35 = local_a38 * 5.641515e-09 +
                             dVar46 * -3.963222e-06 + local_408 * 0.0014082404 + 3.298677;
                    dVar4 = 2.68685771e-11;
                    dVar30 = -2.444854e-12;
                  }
                  dVar35 = local_a28 * dVar30 + dVar35;
                  local_688._8_4_ = SUB84(dVar35,0);
                  local_688._0_8_ = local_a28 * dVar4 + dVar33;
                  local_688._12_4_ = (int)((ulong)dVar35 >> 0x20);
                  local_678 = local_a28 * 0.0 +
                              local_a38 * 0.0 + dVar46 * 0.0 + local_408 * 0.0 + 2.5;
                  lVar19 = 0;
                  do {
                    (&local_258[0].p)[lVar19] =
                         (double *)
                         (*(double *)(local_718 + lVar19 * 8) * *(double *)(local_ae8 + lVar19 * 8)
                         * (double)(&local_7c8.p)[lVar19]);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  local_418 = 0.0;
                  lVar19 = 0;
                  do {
                    local_418 = local_418 + (double)(&local_258[0].p)[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  uStack_410 = 0;
                  if (1000.0 <= local_408) {
                    local_7d8 = local_a28 * -8.8385564e-14 +
                                local_a38 * 1.00641212e-09 +
                                dVar46 * -4.42258813e-06 + local_408 * 0.00920000082 + 0.76069008;
                    dStack_7d0 = local_a28 * -2.112616e-14 +
                                 local_a38 * 3.944431e-10 +
                                 dVar46 * -2.656384e-06 + local_408 * 0.007871497 + 2.770799;
                    local_7e8 = local_a28 * -4.72084164e-14 +
                                local_a38 * 5.23490188e-10 +
                                dVar46 * -2.21481404e-06 + local_408 * 0.00441437026 + 2.85746029;
                    dStack_7e0 = local_a28 * -5.33508711e-14 +
                                 local_a38 * 5.89161778e-10 +
                                 dVar46 * -2.48445613e-06 + local_408 * 0.00495695526 + 1.77217438;
                    local_7f8 = local_a28 * -1.0181523e-13 +
                                local_a38 * 1.22292535e-09 +
                                dVar46 * -5.73285809e-06 + local_408 * 0.0133909467 + -0.925148505;
                    dStack_7f0 = local_a28 * -2.03647716e-14 +
                                 local_a38 * 2.30053008e-10 +
                                 dVar46 * -9.98825771e-07 + local_408 * 0.00206252743 + 1.71518561;
                    local_808 = local_a28 * -3.39716365e-14 +
                                local_a38 * 4.17906e-10 +
                                dVar46 * -2.01191947e-06 + local_408 * 0.00465588637 + 1.29203842;
                    dStack_800 = local_a28 * -4.67154394e-14 +
                                 local_a38 * 5.95684644e-10 +
                                 dVar46 * -2.98714348e-06 + local_408 * 0.00723990037 + 1.28571772;
                    local_828 = local_a28 * -1.07908535e-14 +
                                local_a38 * 1.1424637e-10 +
                                dVar46 * -6.3365815e-07 + local_408 * 0.00223982013 + 3.0172109;
                    dStack_820 = local_a28 * -1.87727567e-14 +
                                 local_a38 * 2.60179549e-10 +
                                 dVar46 * -1.40894597e-06 + local_408 * 0.00365639292 + 1.87410113;
                    local_858 = local_a28 * 1.17412376e-14 +
                                local_a38 * -8.79461556e-11 +
                                dVar46 * 1.26505228e-07 + local_408 * 0.000548429716 + 2.09288767;
                    dStack_850 = local_a28 * 1.68200992e-14 +
                                 local_a38 * -9.7041987e-11 +
                                 dVar46 * -1.64072518e-07 + local_408 * 0.00217691804 + 2.03399249;
                    local_878 = local_a28 * 1.22833691e-15 +
                                local_a38 * -1.00177799e-11 +
                                dVar46 * 4.19484589e-08 + local_408 * -8.59741137e-05 + 1.56942078;
                    dStack_870 = local_a28 * -2.16717794e-14 +
                                 local_a38 * 2.09470555e-10 +
                                 dVar46 * -7.57966669e-07 + local_408 * 0.00148308754 + 2.28253784;
                    local_848 = local_a28 * 2.00255376e-14 +
                                local_a38 * -1.79566394e-10 +
                                dVar46 * 4.99456778e-07 + local_408 * -4.94024731e-05 + 2.3372792;
                    dStack_840 = local_a28 * 4.98197357e-22 +
                                 local_a38 * -4.73515235e-18 +
                                 dVar46 * 1.61561948e-14 + local_408 * -2.30842973e-11 + 1.50000001;
                    local_818 = local_a28 * -1.25706061e-13 +
                                local_a38 * 1.47222923e-09 +
                                dVar46 * -6.71077915e-06 + local_408 * 0.0146454151 + 1.03611116;
                    local_838 = local_a28 * -1.49641576e-13 +
                                local_a38 * 1.75217689e-09 +
                                dVar46 * -7.98206668e-06 + local_408 * 0.0173972722 + 0.95465642;
                    local_868 = local_a28 * -1.9000289e-13 +
                                local_a38 * 2.21412001e-09 +
                                dVar46 * -1.00256067e-05 + local_408 * 0.0216852677 + 0.0718815;
                    dVar4 = local_a38 * 1.0097038e-10 +
                            dVar46 * -5.68476e-07 + local_408 * 0.0014879768 + 1.92664;
                    local_888 = local_a28 * -6.753351e-15;
                  }
                  else {
                    local_7d8 = local_a28 * 1.31772652e-11 +
                                local_a38 * -3.79285261e-08 +
                                dVar46 * 3.73220008e-05 + local_408 * -0.00990833369 + 3.79372315;
                    dStack_7d0 = local_a28 * 2.07561e-12 +
                                 local_a38 * -7.377636e-09 +
                                 dVar46 * 5.338472e-06 + local_408 * 0.007216595 + 1.106204;
                    local_7e8 = local_a28 * -1.43699548e-13 +
                                local_a38 * 2.45919022e-09 +
                                dVar46 * -7.12356269e-06 + local_408 * 0.00898459677 + 1.35677352;
                    dStack_7e0 = local_a28 * 4.33768865e-12 +
                                 local_a38 * -1.33144093e-08 +
                                 dVar46 * 1.37799446e-05 + local_408 * -0.00324392532 + 3.22118584;
                    local_7f8 = local_a28 * 1.66693956e-11 +
                                local_a38 * -4.84743026e-08 +
                                dVar46 * 4.91800599e-05 + local_408 * -0.0136709788 + 4.14987613;
                    dStack_7f0 = local_a28 * -9.04424499e-13 +
                                 local_a38 * 9.07005884e-10 +
                                 dVar46 * 1.01681433e-06 + local_408 * -0.00061035368 + 2.57953347;
                    local_808 = local_a28 * 1.94314737e-12 +
                                local_a38 * -6.68815981e-09 +
                                dVar46 * 8.2329622e-06 + local_408 * -0.00236661419 + 3.19860411;
                    dStack_800 = local_a28 * 2.54385734e-12 +
                                 local_a38 * -6.87117425e-09 +
                                 dVar46 * 5.73021856e-06 + local_408 * 0.00201095175 + 2.6735904;
                    local_828 = local_a28 * 9.29225124e-12 +
                                local_a38 * -2.42763894e-08 +
                                dVar46 * 2.11582891e-05 + local_408 * -0.00474912051 + 3.30179801;
                    dStack_820 = local_a28 * 1.68741719e-12 +
                                 local_a38 * -3.85091153e-09 +
                                 dVar46 * 2.79489841e-06 + local_408 * 0.000968872143 + 2.76267867;
                    local_858 = local_a28 * 1.3641147e-12 +
                                local_a38 * -3.88113333e-09 +
                                dVar46 * 4.61793841e-06 + local_408 * -0.00240131752 + 2.99201543;
                    dStack_850 = local_a28 * 1.77197817e-12 +
                                 local_a38 * -5.48797062e-09 +
                                 dVar46 * 6.52040211e-06 + local_408 * -0.0020364341 + 3.19864056;
                    local_878 = local_a28 * 2.11265971e-12 +
                                local_a38 * -6.12806624e-09 +
                                dVar46 * 6.64306396e-06 + local_408 * -0.00327931884 + 2.1682671;
                    dStack_870 = local_a28 * 3.24372837e-12 +
                                 local_a38 * -9.68129509e-09 +
                                 dVar46 * 9.84730201e-06 + local_408 * -0.00299673416 + 2.78245636;
                    local_848 = local_a28 * -7.37611761e-12 +
                                local_a38 * 2.01572094e-08 +
                                dVar46 * -1.9478151e-05 + local_408 * 0.00798052075 + 1.34433112;
                    dStack_840 = local_a28 * -9.27732332e-22 +
                                 local_a38 * 2.30081632e-18 +
                                 dVar46 * -1.99591964e-15 + local_408 * 7.05332819e-13 + 1.5;
                    local_818 = local_a28 * 2.69884373e-11 +
                                local_a38 * -6.91588753e-08 +
                                dVar46 * 5.70990292e-05 + local_408 * -0.00757052247 + 2.95920148;
                    local_838 = local_a28 * 2.30509004e-11 +
                                local_a38 * -5.99126606e-08 +
                                dVar46 * 4.97142807e-05 + local_408 * -0.00418658892 + 3.30646568;
                    local_868 = local_a28 * 2.68685771e-11 +
                                local_a38 * -7.08466285e-08 +
                                dVar46 * 5.99438288e-05 + local_408 * -0.0055015427 + 3.29142492;
                    dVar4 = local_a38 * 5.641515e-09 +
                            dVar46 * -3.963222e-06 + local_408 * 0.0014082404 + 2.298677;
                    local_888 = local_a28 * -2.444854e-12;
                  }
                  uStack_810 = 0;
                  uStack_830 = 0;
                  uStack_860 = 0;
                  local_888 = local_888 + dVar4;
                  uStack_880 = 0;
                  uStack_400 = 0;
                  uStack_a30 = 0;
                  uStack_a20 = 0;
                  local_568 = (double)CONCAT44(local_ae8._4_4_,local_ae8._0_4_);
                  local_558 = (double)CONCAT44(local_ae8._12_4_,local_ae8._8_4_);
                  local_548 = (double)CONCAT44(local_ae8._20_4_,local_ae8._16_4_);
                  dStack_540 = (double)local_ae8._24_8_;
                  local_538 = (double)local_ae8._24_8_;
                  dStack_530 = local_ac8;
                  local_528 = local_ac8;
                  dStack_520 = dStack_ac0;
                  local_518 = dStack_ac0;
                  dStack_510 = local_ab8;
                  local_508 = local_ab8;
                  dStack_500 = dStack_ab0;
                  local_4f8 = dStack_ab0;
                  dStack_4f0 = local_aa8;
                  local_4e8 = local_aa8;
                  dStack_4e0 = dStack_aa0;
                  local_4d8 = dStack_aa0;
                  dStack_4d0 = local_a98;
                  local_4c8 = local_a98;
                  dStack_4c0 = dStack_a90;
                  local_4a8 = dStack_a90;
                  dStack_4a0 = local_a88;
                  local_488 = local_a88;
                  uStack_480 = 0;
                  local_498 = local_a80;
                  dStack_490 = dStack_a78;
                  local_478 = dStack_a78;
                  dStack_470 = local_a70;
                  local_468 = local_a70;
                  dStack_460 = dStack_a68;
                  lVar19 = 0x15;
                  local_458 = dStack_a68;
                  dStack_450 = local_a60;
                  local_448 = local_a60;
                  dStack_440 = dStack_a58;
                  local_438 = dStack_a58;
                  dStack_430 = local_a50;
                  local_428 = local_a50;
                  dStack_420 = dStack_a48;
                  local_4b8 = dStack_a48;
                  uStack_4b0 = 0;
                  dVar4 = 0.0;
                  do {
                    dVar4 = dVar4 + *pdVar28;
                    pdVar28 = pdVar28 + LVar15;
                    lVar19 = lVar19 + -1;
                  } while (lVar19 != 0);
                  memset(local_ae8,0,0xa8);
                  lVar19 = 0;
                  do {
                    *(double *)(local_ae8 + lVar19 * 8) = *pdVar23 * (1.0 / dVar4);
                    lVar19 = lVar19 + 1;
                    pdVar23 = pdVar23 + LVar15;
                  } while (lVar19 != 0x15);
                  dVar4 = local_8f8[iVar18 - local_910];
                  dVar35 = dVar4 * dVar4;
                  local_578 = dVar4 * dVar35;
                  dVar30 = dVar4 * local_578;
                  local_7c8.p = (double *)0x3fdfbefbefbefbf0;
                  local_7c8.jstride = 0x3fefbefbefbefbf0;
                  local_7c8.kstride = 0x3fb000418a43bf8c;
                  local_7c8.nstride = 0x3fa000418a43bf8c;
                  local_7c8.begin.x = -0x48f1ed02;
                  local_7c8.begin.y = 0x3fae1af1;
                  local_7c8.begin.z = -0xa963427;
                  local_7c8.end.x = 0x3fac6bb6;
                  local_7c8.end.y = 0x42c3dbd3;
                  local_7c8.end.z = 0x3f9f0650;
                  local_7c8.ncomp = -0x2085bd62;
                  local_7c8._60_4_ = 0x3fb24021;
                  local_788 = 0x3fb24021df7a429e;
                  uStack_780 = 0x3fb106e55a53f15b;
                  local_778 = 0x3fafea0b02aa32d7;
                  uStack_770 = 0x3fa24778bbe8f7dd;
                  local_768 = 0x3f9744998b9a1c0d;
                  uStack_760 = 0x3fa1a4eba7fd99b3;
                  local_758 = 0x3fa10d488e47ecc4;
                  uStack_750 = 0x3fa07f7f2eefd932;
                  local_748 = 0x3fa24021df7a429e;
                  uStack_740 = 0x3fa19e14f6ff5920;
                  local_738 = 0x3fa106e55a53f15b;
                  uStack_730 = 0x3fa246cdaf410bdd;
                  local_728 = 0x3f99a1cd6070c7ee;
                  if (1000.0 <= dVar4) {
                    local_718._0_8_ =
                         dVar30 * 2.00255376e-14 +
                         local_578 * -1.79566394e-10 +
                         dVar35 * 4.99456778e-07 + dVar4 * -4.94024731e-05 + 3.3372792;
                    local_718._8_8_ =
                         (FabArrayBase *)
                         (dVar30 * 4.98197357e-22 +
                         local_578 * -4.73515235e-18 +
                         dVar35 * 1.61561948e-14 + dVar4 * -2.30842973e-11 + 2.50000001);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(dVar30 * 1.22833691e-15 +
                                  local_578 * -1.00177799e-11 +
                                  dVar35 * 4.19484589e-08 + dVar4 * -8.59741137e-05 + 2.56942078);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar30 * -2.16717794e-14 +
                                  local_578 * 2.09470555e-10 +
                                  dVar35 * -7.57966669e-07 + dVar4 * 0.00148308754 + 3.28253784);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(dVar30 * 1.17412376e-14 +
                                  local_578 * -8.79461556e-11 +
                                  dVar35 * 1.26505228e-07 + dVar4 * 0.000548429716 + 3.09288767);
                    local_6f0 = dVar30 * 1.68200992e-14 +
                                local_578 * -9.7041987e-11 +
                                dVar35 * -1.64072518e-07 + dVar4 * 0.00217691804 + 3.03399249;
                    local_6e8 = dVar30 * -1.07908535e-14 +
                                local_578 * 1.1424637e-10 +
                                dVar35 * -6.3365815e-07 + dVar4 * 0.00223982013 + 4.0172109;
                    pVStack_6e0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar30 * -1.87727567e-14 +
                                  local_578 * 2.60179549e-10 +
                                  dVar35 * -1.40894597e-06 + dVar4 * 0.00365639292 + 2.87410113);
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar30 * -3.39716365e-14 +
                                local_578 * 4.17906e-10 +
                                dVar35 * -2.01191947e-06 + dVar4 * 0.00465588637 + 2.29203842);
                    pVStack_6d0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (dVar30 * -4.67154394e-14 +
                                  local_578 * 5.95684644e-10 +
                                  dVar35 * -2.98714348e-06 + dVar4 * 0.00723990037 + 2.28571772);
                    local_6c8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar30 * -1.0181523e-13 +
                                local_578 * 1.22292535e-09 +
                                dVar35 * -5.73285809e-06 + dVar4 * 0.0133909467 + 0.074851495);
                    pVStack_6c0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar30 * -2.03647716e-14 +
                                  local_578 * 2.30053008e-10 +
                                  dVar35 * -9.98825771e-07 + dVar4 * 0.00206252743 + 2.71518561);
                    local_6b8 = dVar30 * -4.72084164e-14 +
                                local_578 * 5.23490188e-10 +
                                dVar35 * -2.21481404e-06 + dVar4 * 0.00441437026 + 3.85746029;
                    dStack_6b0 = dVar30 * -5.33508711e-14 +
                                 local_578 * 5.89161778e-10 +
                                 dVar35 * -2.48445613e-06 + dVar4 * 0.00495695526 + 2.77217438;
                    local_6a8 = dVar30 * -8.8385564e-14 +
                                local_578 * 1.00641212e-09 +
                                dVar35 * -4.42258813e-06 + dVar4 * 0.00920000082 + 1.76069008;
                    dStack_6a0 = dVar30 * -2.112616e-14 +
                                 local_578 * 3.944431e-10 +
                                 dVar35 * -2.656384e-06 + dVar4 * 0.007871497 + 3.770799;
                    local_698 = dVar30 * -1.25706061e-13 +
                                local_578 * 1.47222923e-09 +
                                dVar35 * -6.71077915e-06 + dVar4 * 0.0146454151 + 2.03611116;
                    dStack_690 = dVar30 * -1.49641576e-13 +
                                 local_578 * 1.75217689e-09 +
                                 dVar35 * -7.98206668e-06 + dVar4 * 0.0173972722 + 1.95465642;
                    dVar36 = local_578 * 2.21412001e-09 +
                             dVar35 * -1.00256067e-05 + dVar4 * 0.0216852677 + 1.0718815;
                    dVar37 = local_578 * 1.0097038e-10 +
                             dVar35 * -5.68476e-07 + dVar4 * 0.0014879768 + 2.92664;
                    dVar33 = -1.9000289e-13;
                    dVar34 = -6.753351e-15;
                  }
                  else {
                    local_718._0_8_ =
                         dVar30 * -7.37611761e-12 +
                         local_578 * 2.01572094e-08 +
                         dVar35 * -1.9478151e-05 + dVar4 * 0.00798052075 + 2.34433112;
                    local_718._8_8_ =
                         (FabArrayBase *)
                         (dVar30 * -9.27732332e-22 +
                         local_578 * 2.30081632e-18 +
                         dVar35 * -1.99591964e-15 + dVar4 * 7.05332819e-13 + 2.5);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(dVar30 * 2.11265971e-12 +
                                  local_578 * -6.12806624e-09 +
                                  dVar35 * 6.64306396e-06 + dVar4 * -0.00327931884 + 3.1682671);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar30 * 3.24372837e-12 +
                                  local_578 * -9.68129509e-09 +
                                  dVar35 * 9.84730201e-06 + dVar4 * -0.00299673416 + 3.78245636);
                    vStack_708.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(dVar30 * 1.3641147e-12 +
                                  local_578 * -3.88113333e-09 +
                                  dVar35 * 4.61793841e-06 + dVar4 * -0.00240131752 + 3.99201543);
                    local_6f0 = dVar30 * 1.77197817e-12 +
                                local_578 * -5.48797062e-09 +
                                dVar35 * 6.52040211e-06 + dVar4 * -0.0020364341 + 4.19864056;
                    local_6e8 = dVar30 * 9.29225124e-12 +
                                local_578 * -2.42763894e-08 +
                                dVar35 * 2.11582891e-05 + dVar4 * -0.00474912051 + 4.30179801;
                    pVStack_6e0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar30 * 1.68741719e-12 +
                                  local_578 * -3.85091153e-09 +
                                  dVar35 * 2.79489841e-06 + dVar4 * 0.000968872143 + 3.76267867);
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar30 * 1.94314737e-12 +
                                local_578 * -6.68815981e-09 +
                                dVar35 * 8.2329622e-06 + dVar4 * -0.00236661419 + 4.19860411);
                    pVStack_6d0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (dVar30 * 2.54385734e-12 +
                                  local_578 * -6.87117425e-09 +
                                  dVar35 * 5.73021856e-06 + dVar4 * 0.00201095175 + 3.6735904);
                    local_6c8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar30 * 1.66693956e-11 +
                                local_578 * -4.84743026e-08 +
                                dVar35 * 4.91800599e-05 + dVar4 * -0.0136709788 + 5.14987613);
                    pVStack_6c0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar30 * -9.04424499e-13 +
                                  local_578 * 9.07005884e-10 +
                                  dVar35 * 1.01681433e-06 + dVar4 * -0.00061035368 + 3.57953347);
                    local_6b8 = dVar30 * -1.43699548e-13 +
                                local_578 * 2.45919022e-09 +
                                dVar35 * -7.12356269e-06 + dVar4 * 0.00898459677 + 2.35677352;
                    dStack_6b0 = dVar30 * 4.33768865e-12 +
                                 local_578 * -1.33144093e-08 +
                                 dVar35 * 1.37799446e-05 + dVar4 * -0.00324392532 + 4.22118584;
                    local_6a8 = dVar30 * 1.31772652e-11 +
                                local_578 * -3.79285261e-08 +
                                dVar35 * 3.73220008e-05 + dVar4 * -0.00990833369 + 4.79372315;
                    dStack_6a0 = dVar30 * 2.07561e-12 +
                                 local_578 * -7.377636e-09 +
                                 dVar35 * 5.338472e-06 + dVar4 * 0.007216595 + 2.106204;
                    local_698 = dVar30 * 2.69884373e-11 +
                                local_578 * -6.91588753e-08 +
                                dVar35 * 5.70990292e-05 + dVar4 * -0.00757052247 + 3.95920148;
                    dStack_690 = dVar30 * 2.30509004e-11 +
                                 local_578 * -5.99126606e-08 +
                                 dVar35 * 4.97142807e-05 + dVar4 * -0.00418658892 + 4.30646568;
                    dVar36 = local_578 * -7.08466285e-08 +
                             dVar35 * 5.99438288e-05 + dVar4 * -0.0055015427 + 4.29142492;
                    dVar37 = local_578 * 5.641515e-09 +
                             dVar35 * -3.963222e-06 + dVar4 * 0.0014082404 + 3.298677;
                    dVar33 = 2.68685771e-11;
                    dVar34 = -2.444854e-12;
                  }
                  local_688._8_8_ = dVar30 * dVar34 + dVar37;
                  local_688._0_8_ = dVar30 * dVar33 + dVar36;
                  local_678 = dVar30 * 0.0 + local_578 * 0.0 + dVar35 * 0.0 + dVar4 * 0.0 + 2.5;
                  lVar19 = 0;
                  do {
                    (&local_258[0].p)[lVar19] =
                         (double *)
                         (*(double *)(local_718 + lVar19 * 8) * *(double *)(local_ae8 + lVar19 * 8)
                         * (double)(&local_7c8.p)[lVar19]);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  dVar33 = 0.0;
                  lVar19 = 0;
                  do {
                    dVar33 = dVar33 + (double)(&local_258[0].p)[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  uStack_570 = 0;
                  if (1000.0 <= dVar4) {
                    local_898 = dVar30 * -8.8385564e-14 +
                                local_578 * 1.00641212e-09 +
                                dVar35 * -4.42258813e-06 + dVar4 * 0.00920000082 + 0.76069008;
                    dStack_890 = dVar30 * -2.112616e-14 +
                                 local_578 * 3.944431e-10 +
                                 dVar35 * -2.656384e-06 + dVar4 * 0.007871497 + 2.770799;
                    local_8a8 = dVar30 * -4.72084164e-14 +
                                local_578 * 5.23490188e-10 +
                                dVar35 * -2.21481404e-06 + dVar4 * 0.00441437026 + 2.85746029;
                    dStack_8a0 = dVar30 * -5.33508711e-14 +
                                 local_578 * 5.89161778e-10 +
                                 dVar35 * -2.48445613e-06 + dVar4 * 0.00495695526 + 1.77217438;
                    local_8b8 = dVar30 * -1.0181523e-13 +
                                local_578 * 1.22292535e-09 +
                                dVar35 * -5.73285809e-06 + dVar4 * 0.0133909467 + -0.925148505;
                    dStack_8b0 = dVar30 * -2.03647716e-14 +
                                 local_578 * 2.30053008e-10 +
                                 dVar35 * -9.98825771e-07 + dVar4 * 0.00206252743 + 1.71518561;
                    dVar36 = dVar30 * -3.39716365e-14 +
                             local_578 * 4.17906e-10 +
                             dVar35 * -2.01191947e-06 + dVar4 * 0.00465588637 + 1.29203842;
                    dVar37 = dVar30 * -4.67154394e-14 +
                             local_578 * 5.95684644e-10 +
                             dVar35 * -2.98714348e-06 + dVar4 * 0.00723990037 + 1.28571772;
                    dVar40 = dVar30 * 2.00255376e-14 +
                             local_578 * -1.79566394e-10 +
                             dVar35 * 4.99456778e-07 + dVar4 * -4.94024731e-05 + 2.3372792;
                    dVar41 = dVar30 * -1.87727567e-14 +
                             local_578 * 2.60179549e-10 +
                             dVar35 * -1.40894597e-06 + dVar4 * 0.00365639292 + 1.87410113;
                    dVar44 = dVar30 * 1.22833691e-15 +
                             local_578 * -1.00177799e-11 +
                             dVar35 * 4.19484589e-08 + dVar4 * -8.59741137e-05 + 1.56942078;
                    dVar45 = dVar30 * 4.98197357e-22 +
                             local_578 * -4.73515235e-18 +
                             dVar35 * 1.61561948e-14 + dVar4 * -2.30842973e-11 + 1.50000001;
                    dVar42 = dVar30 * 1.17412376e-14 +
                             local_578 * -8.79461556e-11 +
                             dVar35 * 1.26505228e-07 + dVar4 * 0.000548429716 + 2.09288767;
                    dVar43 = dVar30 * -2.16717794e-14 +
                             local_578 * 2.09470555e-10 +
                             dVar35 * -7.57966669e-07 + dVar4 * 0.00148308754 + 2.28253784;
                    dVar38 = dVar30 * -1.07908535e-14 +
                             local_578 * 1.1424637e-10 +
                             dVar35 * -6.3365815e-07 + dVar4 * 0.00223982013 + 3.0172109;
                    dVar39 = dVar30 * 1.68200992e-14 +
                             local_578 * -9.7041987e-11 +
                             dVar35 * -1.64072518e-07 + dVar4 * 0.00217691804 + 2.03399249;
                    dVar47 = dVar30 * -1.25706061e-13 +
                             local_578 * 1.47222923e-09 +
                             dVar35 * -6.71077915e-06 + dVar4 * 0.0146454151 + 1.03611116;
                    dVar48 = dVar30 * -1.49641576e-13 +
                             local_578 * 1.75217689e-09 +
                             dVar35 * -7.98206668e-06 + dVar4 * 0.0173972722 + 0.95465642;
                    dVar49 = dVar30 * -1.9000289e-13 +
                             local_578 * 2.21412001e-09 +
                             dVar35 * -1.00256067e-05 + dVar4 * 0.0216852677 + 0.0718815;
                    dVar34 = dVar30 * -6.753351e-15 +
                             local_578 * 1.0097038e-10 +
                             dVar35 * -5.68476e-07 + dVar4 * 0.0014879768 + 1.92664;
                  }
                  else {
                    local_898 = dVar30 * 1.31772652e-11 +
                                local_578 * -3.79285261e-08 +
                                dVar35 * 3.73220008e-05 + dVar4 * -0.00990833369 + 3.79372315;
                    dStack_890 = dVar30 * 2.07561e-12 +
                                 local_578 * -7.377636e-09 +
                                 dVar35 * 5.338472e-06 + dVar4 * 0.007216595 + 1.106204;
                    local_8a8 = dVar30 * -1.43699548e-13 +
                                local_578 * 2.45919022e-09 +
                                dVar35 * -7.12356269e-06 + dVar4 * 0.00898459677 + 1.35677352;
                    dStack_8a0 = dVar30 * 4.33768865e-12 +
                                 local_578 * -1.33144093e-08 +
                                 dVar35 * 1.37799446e-05 + dVar4 * -0.00324392532 + 3.22118584;
                    local_8b8 = dVar30 * 1.66693956e-11 +
                                local_578 * -4.84743026e-08 +
                                dVar35 * 4.91800599e-05 + dVar4 * -0.0136709788 + 4.14987613;
                    dStack_8b0 = dVar30 * -9.04424499e-13 +
                                 local_578 * 9.07005884e-10 +
                                 dVar35 * 1.01681433e-06 + dVar4 * -0.00061035368 + 2.57953347;
                    dVar36 = dVar30 * 1.94314737e-12 +
                             local_578 * -6.68815981e-09 +
                             dVar35 * 8.2329622e-06 + dVar4 * -0.00236661419 + 3.19860411;
                    dVar37 = dVar30 * 2.54385734e-12 +
                             local_578 * -6.87117425e-09 +
                             dVar35 * 5.73021856e-06 + dVar4 * 0.00201095175 + 2.6735904;
                    dVar40 = dVar30 * -7.37611761e-12 +
                             local_578 * 2.01572094e-08 +
                             dVar35 * -1.9478151e-05 + dVar4 * 0.00798052075 + 1.34433112;
                    dVar41 = dVar30 * 1.68741719e-12 +
                             local_578 * -3.85091153e-09 +
                             dVar35 * 2.79489841e-06 + dVar4 * 0.000968872143 + 2.76267867;
                    dVar44 = dVar30 * 2.11265971e-12 +
                             local_578 * -6.12806624e-09 +
                             dVar35 * 6.64306396e-06 + dVar4 * -0.00327931884 + 2.1682671;
                    dVar45 = dVar30 * -9.27732332e-22 +
                             local_578 * 2.30081632e-18 +
                             dVar35 * -1.99591964e-15 + dVar4 * 7.05332819e-13 + 1.5;
                    dVar42 = dVar30 * 1.3641147e-12 +
                             local_578 * -3.88113333e-09 +
                             dVar35 * 4.61793841e-06 + dVar4 * -0.00240131752 + 2.99201543;
                    dVar43 = dVar30 * 3.24372837e-12 +
                             local_578 * -9.68129509e-09 +
                             dVar35 * 9.84730201e-06 + dVar4 * -0.00299673416 + 2.78245636;
                    dVar38 = dVar30 * 9.29225124e-12 +
                             local_578 * -2.42763894e-08 +
                             dVar35 * 2.11582891e-05 + dVar4 * -0.00474912051 + 3.30179801;
                    dVar39 = dVar30 * 1.77197817e-12 +
                             local_578 * -5.48797062e-09 +
                             dVar35 * 6.52040211e-06 + dVar4 * -0.0020364341 + 3.19864056;
                    dVar47 = dVar30 * 2.69884373e-11 +
                             local_578 * -6.91588753e-08 +
                             dVar35 * 5.70990292e-05 + dVar4 * -0.00757052247 + 2.95920148;
                    dVar48 = dVar30 * 2.30509004e-11 +
                             local_578 * -5.99126606e-08 +
                             dVar35 * 4.97142807e-05 + dVar4 * -0.00418658892 + 3.30646568;
                    dVar49 = dVar30 * 2.68685771e-11 +
                             local_578 * -7.08466285e-08 +
                             dVar35 * 5.99438288e-05 + dVar4 * -0.0055015427 + 3.29142492;
                    dVar34 = dVar30 * -2.444854e-12 +
                             local_578 * 5.641515e-09 +
                             dVar35 * -3.963222e-06 + dVar4 * 0.0014082404 + 2.298677;
                  }
                  auVar31._0_8_ =
                       ((local_a28 * 0.0 + local_a38 * 0.0 + dVar46 * 0.0 + local_408 * 0.0 + 1.5) *
                        local_4b8 * 0.025031289111389236 +
                       local_428 * local_888 * 0.03569643749553795 +
                       local_438 * local_868 * 0.03325573661456601 +
                       local_448 * local_838 * 0.034409194136673316 +
                       local_458 * local_818 * 0.035645540742853074 +
                       dStack_7d0 * local_468 * 0.032222723464587225 +
                       local_7d8 * local_478 * 0.033304469459801506 +
                       dStack_7e0 * local_498 * 0.03446136880556896 +
                       local_488 * local_7e8 * 0.022722624917630486 +
                       local_4a8 * dStack_7f0 * 0.035701535166012134 +
                       local_4c8 * local_7f8 * 0.06233248145608677 +
                       local_4d8 * dStack_800 * 0.06651147322913202 +
                       local_4e8 * local_808 * 0.07129108148570615 +
                       local_4f8 * dStack_820 * 0.07129108148570615 +
                       local_508 * local_828 * 0.030297521662727988 +
                       local_518 * dStack_850 * 0.055509297807382736 +
                       local_528 * local_858 * 0.05879931792791203 +
                       local_538 * dStack_870 * 0.03125195324707794 +
                       local_548 * local_878 * 0.06250390649415588 +
                       local_558 * dStack_840 * 0.9920634920634921 +
                       local_568 * local_848 * 0.49603174603174605 + 0.0) * 83144626.1815324;
                  auVar31._8_8_ =
                       ((dVar30 * 0.0 + local_578 * 0.0 + dVar35 * 0.0 + dVar4 * 0.0 + 1.5) *
                        dStack_a48 * 0.025031289111389236 +
                       local_a50 * dVar34 * 0.03569643749553795 +
                       dStack_a58 * dVar49 * 0.03325573661456601 +
                       local_a60 * dVar48 * 0.034409194136673316 +
                       dStack_a68 * dVar47 * 0.035645540742853074 +
                       dStack_890 * local_a70 * 0.032222723464587225 +
                       local_898 * dStack_a78 * 0.033304469459801506 +
                       dStack_8a0 * local_a80 * 0.03446136880556896 +
                       local_a88 * local_8a8 * 0.022722624917630486 +
                       dStack_a90 * dStack_8b0 * 0.035701535166012134 +
                       local_a98 * local_8b8 * 0.06233248145608677 +
                       dStack_aa0 * dVar37 * 0.06651147322913202 +
                       local_aa8 * dVar36 * 0.07129108148570615 +
                       dStack_ab0 * dVar41 * 0.07129108148570615 +
                       local_ab8 * dVar38 * 0.030297521662727988 +
                       dStack_ac0 * dVar39 * 0.055509297807382736 +
                       local_ac8 * dVar42 * 0.05879931792791203 +
                       (double)local_ae8._24_8_ * dVar43 * 0.03125195324707794 +
                       (double)CONCAT44(local_ae8._20_4_,local_ae8._16_4_) * dVar44 *
                       0.06250390649415588 +
                       (double)CONCAT44(local_ae8._12_4_,local_ae8._8_4_) * dVar45 *
                       0.9920634920634921 +
                       (double)CONCAT44(local_ae8._4_4_,local_ae8._0_4_) * dVar40 *
                       0.49603174603174605 + 0.0) * 83144626.1815324;
                  auVar32._8_8_ = dVar33 * 83144626.1815324;
                  auVar32._0_8_ = local_418 * 83144626.1815324;
                  auVar32 = divpd(auVar31,auVar32);
                  auVar8._8_8_ = RStack_580;
                  auVar8._0_8_ = local_588;
                  auVar32 = divpd(auVar32,auVar8);
                  local_900[iVar18 - local_918] = (auVar32._8_8_ + auVar32._0_8_) * 0.5;
                  bVar29 = iVar18 != iVar12;
                  iVar18 = iVar18 + 1;
                } while (bVar29);
              }
              bVar29 = iVar10 != iVar13;
              iVar10 = iVar10 + 1;
            } while (bVar29);
          }
          bVar29 = iVar9 != iVar14;
          iVar9 = iVar9 + 1;
        } while (bVar29);
      }
      amrex::MFIter::operator++(&local_2b8);
    } while (local_2b8.currentIndex < local_2b8.endIndex);
  }
  amrex::MFIter::~MFIter(&local_2b8);
  this_01 = local_a18;
  RVar5 = getMFsum(local_a18,mac_divu,0);
  RVar6 = getMFsum(this_01,(MultiFab *)&local_1b0,0);
  dVar46 = RVar5 / lev0cellCount;
  thetabar = RVar6 / lev0cellCount;
  amrex::MultiFab::plus(mac_divu,-dVar46,0,1,0);
  amrex::MultiFab::plus((MultiFab *)&local_1b0,-thetabar,0,1,0);
  dp0dt = dVar46 / thetabar;
  p_amb_new = (dVar3 - dVar2) * dp0dt + p_amb_old;
  amrex::MFIter::MFIter((MFIter *)local_718,(FabArrayBase *)mac_divu,true);
  if ((int)vStack_708.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_6f0._0_4_) {
    do {
      amrex::MFIter::tilebox((Box *)local_ae8,(MFIter *)local_718);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (local_258,&mac_divu->super_FabArray<amrex::FArrayBox>,(MFIter *)local_718);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_7c8,&local_1b0,(MFIter *)local_718);
      if ((int)local_ae8._8_4_ <= (int)local_ae8._20_4_) {
        dVar3 = dVar46 / thetabar;
        lVar19 = (long)(int)local_ae8._4_4_;
        local_a38 = (double)((lVar19 - local_258[0].begin.y) * local_258[0].jstride * 8 +
                             (long)(int)local_ae8._0_4_ * 8 + (long)local_258[0].begin.x * -8 +
                            (long)local_258[0].p);
        local_a28 = (double)(local_258[0].kstride * 8);
        iVar21 = local_ae8._8_4_;
        do {
          if ((int)local_ae8._4_4_ <= (int)local_ae8._16_4_) {
            lVar25 = ((long)iVar21 - (long)local_258[0].begin.z) * (long)local_a28 + (long)local_a38
            ;
            lVar24 = (long)local_7c8.p +
                     ((long)iVar21 - (long)local_7c8.begin.z) * local_7c8.kstride * 8 +
                     (lVar19 - local_7c8.begin.y) * local_7c8.jstride * 8 +
                     (long)(int)local_ae8._0_4_ * 8 + (long)local_7c8.begin.x * -8;
            lVar22 = lVar19;
            do {
              if ((int)local_ae8._0_4_ <= (int)local_ae8._12_4_) {
                lVar27 = 0;
                do {
                  *(double *)(lVar25 + lVar27 * 8) =
                       *(double *)(lVar25 + lVar27 * 8) - *(double *)(lVar24 + lVar27 * 8) * dVar3;
                  lVar27 = lVar27 + 1;
                } while ((local_ae8._12_4_ - local_ae8._0_4_) + 1 != (int)lVar27);
              }
              lVar22 = lVar22 + 1;
              lVar25 = lVar25 + local_258[0].jstride * 8;
              lVar24 = lVar24 + local_7c8.jstride * 8;
            } while (local_ae8._16_4_ + 1 != (int)lVar22);
          }
          bVar29 = iVar21 != local_ae8._20_4_;
          iVar21 = iVar21 + 1;
        } while (bVar29);
      }
      amrex::MFIter::operator++((MFIter *)local_718);
    } while ((int)vStack_708.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_6f0._0_4_);
  }
  amrex::MFIter::~MFIter((MFIter *)local_718);
  if (NavierStokesBase::verbose != 0) {
    local_718._8_8_ = amrex::OutStream();
    local_718._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_718._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_708);
    *(undefined8 *)
     ((long)&vStack_708.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     vStack_708.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((*(_func_int ***)local_718._8_8_)[-3] + (long)&((BoxArray *)(local_718._8_8_ + 8))->m_bat
          );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&vStack_708,"level 0: prev_time, p_amb_old, p_amb_new, delta = ",0x32);
    std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_708," ",1);
    std::ostream::_M_insert<double>(p_amb_old);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_708," ",1);
    std::ostream::_M_insert<double>(p_amb_new);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_708," ",1);
    std::ostream::_M_insert<double>(p_amb_new - p_amb_old);
    cVar7 = (char)(ostringstream *)&vStack_708;
    std::ios::widen((char)vStack_708.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    amrex::Print::~Print((Print *)local_718);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return dVar46;
}

Assistant:

Real
PeleLM::adjust_p_and_divu_for_closed_chamber(MultiFab& mac_divu)
{
   const MultiFab& S_new = get_new_data(State_Type);
   const MultiFab& S_old = get_old_data(State_Type);

   const Real prev_time = state[State_Type].prevTime();
   const Real cur_time  = state[State_Type].curTime();
   const Real dt = cur_time - prev_time;

   // used for closed chamber algorithm
   MultiFab theta_halft(grids,dmap,1,nGrowAdvForcing);

   // compute old, new, and time-centered theta = 1 / (gamma P)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY_o  = S_old.const_array(mfi,first_spec);
      auto const& rhoY_n  = S_new.const_array(mfi,first_spec);
      auto const& T_o     = S_old.const_array(mfi,Temp);
      auto const& T_n     = S_new.const_array(mfi,Temp);
      auto const& theta   = theta_halft.array(mfi);
      amrex::Real pamb_o  = p_amb_old;
      amrex::Real pamb_n  = p_amb_new;

      amrex::ParallelFor(bx, [rhoY_o, rhoY_n, T_o, T_n, theta, pamb_o, pamb_n]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         amrex::Real gammaInv_o = getGammaInv( i, j, k, rhoY_o, T_o );
         amrex::Real gammaInv_n = getGammaInv( i, j, k, rhoY_n, T_n );
         theta(i,j,k) = 0.5 * ( gammaInv_o/pamb_o + gammaInv_n/pamb_n );
      });
   }

   // Get S sum and theta sum
   Real Ssum = getMFsum(mac_divu,0);
   Real thetasum = getMFsum(theta_halft,0);

   // Normalize by cell count / uncovered cell count if EB
   Real Sbar = Ssum/lev0cellCount;
   thetabar  = thetasum/lev0cellCount;

   // subtract mean from mac_divu and theta_nph
   mac_divu.plus(-Sbar,0,1);
   theta_halft.plus(-thetabar,0,1);

   p_amb_new = p_amb_old + dt*(Sbar/thetabar);
   dp0dt = Sbar/thetabar;

   // update mac rhs by adding delta_theta * (Sbar / thetabar)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(mac_divu,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& m_divu  = mac_divu.array(mfi);
      auto const& theta   = theta_halft.const_array(mfi);
      amrex::Real scaling = Sbar/thetabar;

      amrex::ParallelFor(bx, [m_divu, theta, scaling]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         m_divu(i,j,k) -= theta(i,j,k) * scaling;
      });
   }

   if (verbose) {
      amrex::Print() << "level 0: prev_time, p_amb_old, p_amb_new, delta = "
                     << prev_time << " " << p_amb_old << " " << p_amb_new << " "
                     << p_amb_new-p_amb_old << std::endl;
   }

   return Sbar;
}